

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O3

StrWriter * __thiscall
moira::StrWriter::operator<<(StrWriter *this,IxMot<(moira::Mode)10,_2> wrapper)

{
  char cVar1;
  uint uVar2;
  Syntax SVar3;
  i32 iVar4;
  Int IVar5;
  char *pcVar6;
  byte *pbVar7;
  Int IVar8;
  short sVar9;
  char *pcVar10;
  sbyte sVar11;
  ushort uVar12;
  uint uVar13;
  uint uVar14;
  Rn rn;
  short sVar15;
  uint uVar16;
  uint uVar17;
  
  uVar2 = (wrapper.ea)->ext1;
  if ((uVar2 >> 8 & 1) == 0) {
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = '(';
    operator<<(this,(Int)(int)(char)uVar2);
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    operator<<(this);
    pcVar10 = this->ptr;
    this->ptr = pcVar10 + 1;
    *pcVar10 = ',';
    uVar16 = uVar2 >> 9 & 3;
    operator<<(this,(Rn)(uVar2 >> 0xc & 0xf));
    pcVar10 = "$%x.l";
    if ((uVar2 >> 0xb & 1) == 0) {
      pcVar10 = "$%x.w";
    }
    pcVar10 = pcVar10 + 3;
    cVar1 = *pcVar10;
    while (cVar1 != '\0') {
      pcVar10 = pcVar10 + 1;
      pcVar6 = this->ptr;
      this->ptr = pcVar6 + 1;
      *pcVar6 = cVar1;
      cVar1 = *pcVar10;
    }
    if ((uVar16 != 0) && (SVar3 = this->style->syntax, SVar3 < (MUSASHI|MOIRA_MIT))) {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar3 << 3) & 0x3f));
      pbVar7 = (byte *)this->ptr;
      this->ptr = (char *)(pbVar7 + 1);
      *pbVar7 = (byte)(1 << (sbyte)uVar16) | 0x30;
    }
  }
  else {
    uVar13 = uVar2 & 0xffff;
    rn.raw = uVar13 >> 0xc;
    uVar16 = uVar13 >> 0xb;
    uVar17 = uVar2 >> 9 & 3;
    uVar14 = uVar13 >> 7;
    uVar13 = uVar13 >> 6;
    uVar12 = (ushort)(uVar2 >> 4) & 3;
    iVar4 = (wrapper.ea)->ext2;
    sVar9 = (short)iVar4;
    sVar11 = (sbyte)uVar17;
    sVar15 = (short)uVar17;
    if ((uVar2 & 7) == 0) {
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = '(';
      IVar5.raw = (int)sVar9;
      if (uVar12 == 3) {
        IVar5.raw = iVar4;
      }
      operator<<(this,IVar5);
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar3 = this->style->syntax;
      if ((uVar14 & 1) == 0) {
        if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ' ';
        }
        operator<<(this);
      }
      else {
        if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ' ';
        }
        operator<<(this);
      }
      if ((uVar13 & 1) == 0) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ',';
        SVar3 = this->style->syntax;
        if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ' ';
        }
        operator<<(this,rn);
        pcVar10 = "$%x.l";
        if ((uVar16 & 1) == 0) {
          pcVar10 = "$%x.w";
        }
        pcVar10 = pcVar10 + 3;
        cVar1 = *pcVar10;
        while (cVar1 != '\0') {
          pcVar10 = pcVar10 + 1;
          pcVar6 = this->ptr;
          this->ptr = pcVar6 + 1;
          *pcVar6 = cVar1;
          cVar1 = *pcVar10;
        }
        if ((sVar15 != 0) && (SVar3 = this->style->syntax, SVar3 < (MUSASHI|MOIRA_MIT))) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar3 << 3) & 0x3f));
          pbVar7 = (byte *)this->ptr;
          this->ptr = (char *)(pbVar7 + 1);
          *pbVar7 = '\x01' << sVar11 | 0x30;
        }
      }
    }
    else {
      IVar5.raw = (wrapper.ea)->ext3;
      if ((uVar2 & 4) == 0) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = '(';
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = '[';
        IVar8.raw = (int)sVar9;
        if (uVar12 == 3) {
          IVar8.raw = iVar4;
        }
        operator<<(this,IVar8);
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ',';
        SVar3 = this->style->syntax;
        if ((uVar14 & 1) == 0) {
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this);
        }
        else {
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this);
        }
        if ((uVar13 & 1) == 0) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ',';
          SVar3 = this->style->syntax;
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this,rn);
          pcVar10 = "$%x.l";
          if ((uVar16 & 1) == 0) {
            pcVar10 = "$%x.w";
          }
          pcVar10 = pcVar10 + 3;
          cVar1 = *pcVar10;
          while (cVar1 != '\0') {
            pcVar10 = pcVar10 + 1;
            pcVar6 = this->ptr;
            this->ptr = pcVar6 + 1;
            *pcVar6 = cVar1;
            cVar1 = *pcVar10;
          }
          if ((sVar15 != 0) && (SVar3 = this->style->syntax, SVar3 < (MUSASHI|MOIRA_MIT))) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar3 << 3) & 0x3f));
            pbVar7 = (byte *)this->ptr;
            this->ptr = (char *)(pbVar7 + 1);
            *pbVar7 = '\x01' << sVar11 | 0x30;
          }
        }
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ']';
      }
      else {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = '(';
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = '[';
        IVar8.raw = (int)sVar9;
        if (uVar12 == 3) {
          IVar8.raw = iVar4;
        }
        operator<<(this,IVar8);
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ',';
        SVar3 = this->style->syntax;
        if ((uVar14 & 1) == 0) {
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this);
        }
        else {
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this);
        }
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ']';
        if ((uVar13 & 1) == 0) {
          pcVar10 = this->ptr;
          this->ptr = pcVar10 + 1;
          *pcVar10 = ',';
          SVar3 = this->style->syntax;
          if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = ' ';
          }
          operator<<(this,rn);
          pcVar10 = "$%x.l";
          if ((uVar16 & 1) == 0) {
            pcVar10 = "$%x.w";
          }
          pcVar10 = pcVar10 + 3;
          cVar1 = *pcVar10;
          while (cVar1 != '\0') {
            pcVar10 = pcVar10 + 1;
            pcVar6 = this->ptr;
            this->ptr = pcVar6 + 1;
            *pcVar6 = cVar1;
            cVar1 = *pcVar10;
          }
          if ((sVar15 != 0) && (SVar3 = this->style->syntax, SVar3 < (MUSASHI|MOIRA_MIT))) {
            pcVar10 = this->ptr;
            this->ptr = pcVar10 + 1;
            *pcVar10 = (char)(0x2a3a2a3a2a >> ((byte)(SVar3 << 3) & 0x3f));
            pbVar7 = (byte *)this->ptr;
            this->ptr = (char *)(pbVar7 + 1);
            *pbVar7 = '\x01' << sVar11 | 0x30;
          }
        }
      }
      pcVar10 = this->ptr;
      this->ptr = pcVar10 + 1;
      *pcVar10 = ',';
      SVar3 = this->style->syntax;
      if ((SVar3 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar3 & 0x1f) & 1) != 0)) {
        pcVar10 = this->ptr;
        this->ptr = pcVar10 + 1;
        *pcVar10 = ' ';
      }
      operator<<(this,IVar5);
    }
  }
  pcVar10 = this->ptr;
  this->ptr = pcVar10 + 1;
  *pcVar10 = ')';
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(IxMot<M, S> wrapper)
{
    assert(M == Mode(6) || M == Mode(10));

    auto &ea = wrapper.ea;

    u16 full = _______x________ (ea.ext1);

    if (!full) {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 0  | DISPLACEMENT                         |
        // --------------------------------------------------------------------

        u16 reg   = xxxx____________ (ea.ext1);
        u16 lw    = ____x___________ (ea.ext1);
        u16 scale = _____xx_________ (ea.ext1);
        u16 disp  = ________xxxxxxxx (ea.ext1);

        *this << "(" << Int{(i8)disp} << ",";
        M == Mode(10) ? *this << Pc{} : *this << An{ea.reg};
        *this << "," << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale} << ")";

    } else {

        //   15-12   11   10   09   08   07   06   05   04   03   02   01   00
        // --------------------------------------------------------------------
        // | REG   | LW | SCALE   | 1  | BS | IS | BD SIZE  | 0  | IIS        |
        // --------------------------------------------------------------------

        u16  reg   = xxxx____________ (ea.ext1);
        u16  lw    = ____x___________ (ea.ext1);
        u16  scale = _____xx_________ (ea.ext1);
        u16  bs    = ________x_______ (ea.ext1);
        u16  is    = _________x______ (ea.ext1);
        u16  size  = __________xx____ (ea.ext1);
        u16  iis   = _____________xxx (ea.ext1);
        u32  base  = ea.ext2;
        u32  outer = ea.ext3;

        auto baseDisplacement = [&]() {
            size == 3 ? (*this << Int{(i32)base}) : (*this << Int{(i16)base});
        };
        auto baseRegister = [&]() {
            if constexpr (M == Mode(10)) {
                if (!bs) { *this << Sep{} << Pc{}; } else { *this << Sep{} << Zpc{}; }
            } else {
                if (!bs) { *this << Sep{} << An{ea.reg}; }
            }
        };
        auto indexRegister = [&]() {
            if (!is) *this << Sep{} << Rn{reg} << (lw ? ".l" : ".w") << Scale{scale};
        };
        auto outerDisplacement = [&]() {
            *this << Sep{} << Int(outer);
        };

        if (iis == 0) {

            // Memory Indirect Unindexed
            *this << "(";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << ")";

        } else if (iis & 0b100) {

            // Memory Indirect Postindexed
            *this << "([";
            baseDisplacement(); baseRegister();
            *this << "]";
            indexRegister(); outerDisplacement();
            *this << ")";

        } else {

            // Memory Indirect Preindexed
            *this << "([";
            baseDisplacement(); baseRegister(); indexRegister();
            *this << "]";
            outerDisplacement();
            *this << ")";
        }
    }

    return *this;
}